

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp4::sPolynomial17
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x1cd];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x1e6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x43] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x1ff] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x5c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x218] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x21b];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0xf2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2b1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x13d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2ca] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x156] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2e3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x188] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2fc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1ba] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2ae] / dVar1;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x2e0];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1d3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x315] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1ec] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x205] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2f9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x21e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x312] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x237] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x32e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x250] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x347] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x282] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x360] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2cd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x32b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x379] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2e6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x344] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2ff] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x35d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x318] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x376] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x331] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x392] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x37c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x38f] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial17( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(17,1) = groebnerMatrix(11,19)/(groebnerMatrix(11,18));
  groebnerMatrix(17,2) = groebnerMatrix(11,20)/(groebnerMatrix(11,18));
  groebnerMatrix(17,3) = groebnerMatrix(11,21)/(groebnerMatrix(11,18));
  groebnerMatrix(17,9) = -groebnerMatrix(14,27)/(groebnerMatrix(14,21));
  groebnerMatrix(17,12) = -groebnerMatrix(14,28)/(groebnerMatrix(14,21));
  groebnerMatrix(17,13) = -groebnerMatrix(14,29)/(groebnerMatrix(14,21));
  groebnerMatrix(17,15) = -groebnerMatrix(14,30)/(groebnerMatrix(14,21));
  groebnerMatrix(17,17) = groebnerMatrix(11,27)/(groebnerMatrix(11,18));
  groebnerMatrix(17,18) = (groebnerMatrix(11,28)/(groebnerMatrix(11,18))-groebnerMatrix(14,31)/(groebnerMatrix(14,21)));
  groebnerMatrix(17,19) = groebnerMatrix(11,29)/(groebnerMatrix(11,18));
  groebnerMatrix(17,20) = groebnerMatrix(11,30)/(groebnerMatrix(11,18));
  groebnerMatrix(17,21) = groebnerMatrix(11,31)/(groebnerMatrix(11,18));
  groebnerMatrix(17,22) = -groebnerMatrix(14,32)/(groebnerMatrix(14,21));
  groebnerMatrix(17,23) = -groebnerMatrix(14,33)/(groebnerMatrix(14,21));
  groebnerMatrix(17,25) = -groebnerMatrix(14,34)/(groebnerMatrix(14,21));
  groebnerMatrix(17,28) = (groebnerMatrix(11,32)/(groebnerMatrix(11,18))-groebnerMatrix(14,35)/(groebnerMatrix(14,21)));
  groebnerMatrix(17,29) = groebnerMatrix(11,33)/(groebnerMatrix(11,18));
  groebnerMatrix(17,30) = groebnerMatrix(11,34)/(groebnerMatrix(11,18));
  groebnerMatrix(17,31) = groebnerMatrix(11,35)/(groebnerMatrix(11,18));
  groebnerMatrix(17,32) = -groebnerMatrix(14,36)/(groebnerMatrix(14,21));
  groebnerMatrix(17,35) = groebnerMatrix(11,36)/(groebnerMatrix(11,18));
}